

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MorphableModel.hpp
# Opt level: O0

MorphableModel *
eos::morphablemodel::load_model(MorphableModel *__return_storage_ptr__,string *filename)

{
  byte bVar1;
  runtime_error *this;
  undefined1 local_370 [8];
  BinaryInputArchive input_archive;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  long local_228;
  ifstream file;
  string *filename_local;
  MorphableModel *model;
  
  MorphableModel::MorphableModel(__return_storage_ptr__);
  std::ifstream::ifstream(&local_228,(string *)filename,_S_bin);
  bVar1 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar1 & 1) != 0) {
    input_archive.itsStream._7_1_ = 1;
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_258,"Error opening given file: ",filename);
    std::runtime_error::runtime_error(this,(string *)&local_258);
    input_archive.itsStream._7_1_ = 0;
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  cereal::BinaryInputArchive::BinaryInputArchive
            ((BinaryInputArchive *)local_370,(istream *)&local_228);
  cereal::InputArchive<cereal::BinaryInputArchive,1u>::operator()
            ((InputArchive<cereal::BinaryInputArchive,1u> *)local_370,__return_storage_ptr__);
  cereal::BinaryInputArchive::~BinaryInputArchive((BinaryInputArchive *)local_370);
  std::ifstream::~ifstream(&local_228);
  return __return_storage_ptr__;
}

Assistant:

inline MorphableModel load_model(std::string filename)
{
    MorphableModel model;

    std::ifstream file(filename, std::ios::binary);
    if (!file)
    {
        throw std::runtime_error("Error opening given file: " + filename);
    }
    cereal::BinaryInputArchive input_archive(file);
    input_archive(model);

    return model;
}